

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O3

_Bool golf_editor_is_edit_entity_selected(golf_edit_mode_entity_t entity)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  int *piVar4;
  golf_edit_mode_entity_type_t gVar5;
  int iVar6;
  ulong uVar7;
  _Bool _Var8;
  bool bVar9;
  
  uVar3 = (ulong)editor.edit_mode.selected_entities.length;
  if ((long)uVar3 < 1) {
    _Var8 = false;
  }
  else {
    piVar4 = &(editor.edit_mode.selected_entities.data)->idx2;
    _Var8 = true;
    uVar7 = 1;
    do {
      uVar1 = ((golf_edit_mode_entity_t *)(piVar4 + -2))->type;
      uVar2 = ((golf_edit_mode_entity_t *)(piVar4 + -2))->idx;
      gVar5 = entity.type;
      if (gVar5 == uVar1) {
        iVar6 = entity.idx;
        if (gVar5 == GOLF_EDIT_MODE_ENTITY_POINT) {
LAB_00119d96:
          if (iVar6 == uVar2) {
            return _Var8;
          }
        }
        else if (gVar5 == GOLF_EDIT_MODE_ENTITY_LINE) {
          if (iVar6 == uVar2 && *piVar4 == entity.idx2) {
            return _Var8;
          }
          if (uVar2 == entity.idx2 && *piVar4 == iVar6) {
            return _Var8;
          }
        }
        else if (gVar5 == GOLF_EDIT_MODE_ENTITY_FACE) goto LAB_00119d96;
      }
      _Var8 = uVar7 < uVar3;
      piVar4 = piVar4 + 3;
      bVar9 = uVar7 != uVar3;
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  return _Var8;
}

Assistant:

bool golf_editor_is_edit_entity_selected(golf_edit_mode_entity_t entity) {
    for (int i = 0; i < editor.edit_mode.selected_entities.length; i++) {
        golf_edit_mode_entity_t entity2 = editor.edit_mode.selected_entities.data[i];
        if (golf_editor_edit_entities_compare(entity, entity2)) {
            return true;
        }
    }
    return false;
}